

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O0

void __thiscall jaegertracing::net::URI_testAuthority_Test::TestBody(URI_testAuthority_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_208 [8];
  Message local_200 [15];
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [136];
  string local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_110 [8];
  Message local_108 [31];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [136];
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  URI_testAuthority_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"http://localhost",&local_e9);
  jaegertracing::net::URI::parse(local_c8);
  URI::authority_abi_cxx11_(&local_40,(URI *)local_c8);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_20,"\"localhost\"",
             "URI::parse(\"http://localhost\").authority()",(char (*) [10])0x341b86,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  URI::~URI((URI *)local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    testing::Message::~Message(local_108);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"http://localhost:80",&local_1f1);
    jaegertracing::net::URI::parse(local_1d0);
    URI::authority_abi_cxx11_(&local_148,(URI *)local_1d0);
    testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
              ((EqHelper<false> *)local_128,"\"localhost:80\"",
               "URI::parse(\"http://localhost:80\").authority()",(char (*) [13])0x341bbf,&local_148)
    ;
    std::__cxx11::string::~string((string *)&local_148);
    URI::~URI((URI *)local_1d0);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar1) {
      testing::Message::Message(local_200);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                (local_208,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x25,pcVar2);
      testing::internal::AssertHelper::operator=(local_208,local_200);
      testing::internal::AssertHelper::~AssertHelper(local_208);
      testing::Message::~Message(local_200);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  }
  return;
}

Assistant:

TEST(URI, testAuthority)
{
    ASSERT_EQ("localhost", URI::parse("http://localhost").authority());
    ASSERT_EQ("localhost:80", URI::parse("http://localhost:80").authority());
}